

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

xmlCharEncodingHandlerPtr
xmlNewCharEncodingHandler
          (char *name,xmlCharEncodingInputFunc input,xmlCharEncodingOutputFunc output)

{
  int iVar1;
  xmlCharEncodingInputFunc p_Var2;
  char *pcVar3;
  char *up;
  char local_238 [4];
  int i;
  char upper [500];
  char *alias;
  xmlCharEncodingHandlerPtr handler;
  xmlCharEncodingOutputFunc output_local;
  xmlCharEncodingInputFunc input_local;
  char *name_local;
  
  p_Var2 = (xmlCharEncodingInputFunc)xmlGetEncodingAlias(name);
  input_local = (xmlCharEncodingInputFunc)name;
  if (p_Var2 != (xmlCharEncodingInputFunc)0x0) {
    input_local = p_Var2;
  }
  if (input_local == (xmlCharEncodingInputFunc)0x0) {
    xmlEncodingErr(XML_I18N_NO_NAME,"xmlNewCharEncodingHandler : no name !\n",(char *)0x0);
    name_local = (char *)0x0;
  }
  else {
    for (up._4_4_ = 0; up._4_4_ < 499; up._4_4_ = up._4_4_ + 1) {
      iVar1 = toupper((int)(char)input_local[up._4_4_]);
      local_238[up._4_4_] = (char)iVar1;
      if (local_238[up._4_4_] == '\0') break;
    }
    local_238[up._4_4_] = '\0';
    pcVar3 = (*xmlMemStrdup)(local_238);
    if (pcVar3 == (char *)0x0) {
      xmlEncodingErrMemory("xmlNewCharEncodingHandler : out of memory !\n");
      name_local = (char *)0x0;
    }
    else {
      name_local = (char *)(*xmlMalloc)(0x28);
      if ((xmlCharEncodingHandlerPtr)name_local == (xmlCharEncodingHandlerPtr)0x0) {
        (*xmlFree)(pcVar3);
        xmlEncodingErrMemory("xmlNewCharEncodingHandler : out of memory !\n");
        name_local = (char *)0x0;
      }
      else {
        memset(name_local,0,0x28);
        ((xmlCharEncodingHandlerPtr)name_local)->input = input;
        ((xmlCharEncodingHandlerPtr)name_local)->output = output;
        ((xmlCharEncodingHandlerPtr)name_local)->name = pcVar3;
        ((xmlCharEncodingHandlerPtr)name_local)->iconv_in = (iconv_t)0x0;
        ((xmlCharEncodingHandlerPtr)name_local)->iconv_out = (iconv_t)0x0;
        xmlRegisterCharEncodingHandler((xmlCharEncodingHandlerPtr)name_local);
      }
    }
  }
  return (xmlCharEncodingHandlerPtr)name_local;
}

Assistant:

xmlCharEncodingHandlerPtr
xmlNewCharEncodingHandler(const char *name,
                          xmlCharEncodingInputFunc input,
                          xmlCharEncodingOutputFunc output) {
    xmlCharEncodingHandlerPtr handler;
    const char *alias;
    char upper[500];
    int i;
    char *up = NULL;

    /*
     * Do the alias resolution
     */
    alias = xmlGetEncodingAlias(name);
    if (alias != NULL)
	name = alias;

    /*
     * Keep only the uppercase version of the encoding.
     */
    if (name == NULL) {
        xmlEncodingErr(XML_I18N_NO_NAME,
		       "xmlNewCharEncodingHandler : no name !\n", NULL);
	return(NULL);
    }
    for (i = 0;i < 499;i++) {
        upper[i] = toupper(name[i]);
	if (upper[i] == 0) break;
    }
    upper[i] = 0;
    up = xmlMemStrdup(upper);
    if (up == NULL) {
        xmlEncodingErrMemory("xmlNewCharEncodingHandler : out of memory !\n");
	return(NULL);
    }

    /*
     * allocate and fill-up an handler block.
     */
    handler = (xmlCharEncodingHandlerPtr)
              xmlMalloc(sizeof(xmlCharEncodingHandler));
    if (handler == NULL) {
        xmlFree(up);
        xmlEncodingErrMemory("xmlNewCharEncodingHandler : out of memory !\n");
	return(NULL);
    }
    memset(handler, 0, sizeof(xmlCharEncodingHandler));
    handler->input = input;
    handler->output = output;
    handler->name = up;

#ifdef LIBXML_ICONV_ENABLED
    handler->iconv_in = NULL;
    handler->iconv_out = NULL;
#endif
#ifdef LIBXML_ICU_ENABLED
    handler->uconv_in = NULL;
    handler->uconv_out = NULL;
#endif

    /*
     * registers and returns the handler.
     */
    xmlRegisterCharEncodingHandler(handler);
#ifdef DEBUG_ENCODING
    xmlGenericError(xmlGenericErrorContext,
	    "Registered encoding handler for %s\n", name);
#endif
    return(handler);
}